

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::MidSideNodeIndex
          (TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *this,int side,int64_t *index)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  void *this_00;
  double dVar4;
  TPZGeoElSide *pTVar5;
  TPZGeoEl *pTVar6;
  int64_t iVar7;
  double *pdVar8;
  long lVar9;
  TPZGeoMesh *pTVar10;
  double *in_RDX;
  int in_ESI;
  TPZGeoEl *in_RDI;
  REAL RVar11;
  REAL RVar12;
  REAL aux;
  REAL dif;
  TPZVec<double> auxpt;
  TPZVec<double> centerpt;
  int64_t subnodeindex;
  TPZStack<long,_10> msnindex;
  TPZStack<TPZGeoElSide,_10> subels;
  int nsubel;
  int j;
  int i;
  TPZVec<double> *in_stack_fffffffffffffcb0;
  TPZGeoNode *in_stack_fffffffffffffcb8;
  TPZVec<double> *in_stack_fffffffffffffcc0;
  TPZGeoNode *in_stack_fffffffffffffcc8;
  TPZChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffcd0;
  double local_220;
  double local_218;
  undefined1 local_208 [32];
  undefined8 local_1e8;
  TPZVec<double> local_1e0;
  int64_t local_1c0;
  TPZVec<long> local_1b8 [3];
  undefined4 local_148;
  TPZVec<TPZGeoElSide> local_138 [8];
  int local_24;
  int local_20;
  int local_1c;
  double *local_18;
  int local_c;
  
  *in_RDX = -NAN;
  local_c = in_ESI;
  if ((in_ESI < 0) ||
     (local_18 = in_RDX, iVar1 = (**(code **)(*(long *)in_RDI + 0xf0))(), iVar2 = local_c,
     iVar1 + -1 < in_ESI)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "TPZGeoElRefPattern::MidSideNodeIndex. Bad parameter side = ");
    this_00 = (void *)std::ostream::operator<<(poVar3,local_c);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    iVar1 = (**(code **)(*(long *)in_RDI + 0x98))();
    if (iVar2 < iVar1) {
      dVar4 = (double)(**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_c);
      *local_18 = dVar4;
    }
    else {
      iVar2 = (**(code **)(*(long *)in_RDI + 0x1d0))();
      if (iVar2 != 0) {
        local_24 = (**(code **)(*(long *)in_RDI + 0x150))(in_RDI,local_c);
        TPZStack<TPZGeoElSide,_10>::TPZStack
                  ((TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffcc0);
        (**(code **)(*(long *)in_RDI + 0x268))(in_RDI,local_c,local_138);
        if (local_24 == 1) {
          pTVar5 = TPZVec<TPZGeoElSide>::operator[](local_138,0);
          pTVar6 = TPZGeoElSide::Element(pTVar5);
          pTVar5 = TPZVec<TPZGeoElSide>::operator[](local_138,0);
          iVar2 = TPZGeoElSide::Side(pTVar5);
          (**(code **)(*(long *)pTVar6 + 0x118))(pTVar6,iVar2,local_18);
          local_148 = 1;
        }
        else {
          TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_fffffffffffffcc0);
          for (local_1c = 0; local_1c < local_24; local_1c = local_1c + 1) {
            pTVar5 = TPZVec<TPZGeoElSide>::operator[](local_138,(long)local_1c);
            iVar2 = TPZGeoElSide::Side(pTVar5);
            pTVar5 = TPZVec<TPZGeoElSide>::operator[](local_138,(long)local_1c);
            pTVar6 = TPZGeoElSide::Element(pTVar5);
            iVar1 = (**(code **)(*(long *)pTVar6 + 0x98))();
            if (iVar2 < iVar1) {
              TPZVec<TPZGeoElSide>::operator[](local_138,(long)local_1c);
              local_1c0 = TPZGeoElSide::SideNodeIndex
                                    ((TPZGeoElSide *)in_stack_fffffffffffffcb8,
                                     (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
              TPZStack<long,_10>::Push
                        ((TPZStack<long,_10> *)in_stack_fffffffffffffcc0,
                         (long)in_stack_fffffffffffffcb8);
            }
          }
          iVar7 = TPZVec<long>::NElements(local_1b8);
          if (1 < iVar7) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "TPZGeoElRefPattern<TGeo>::MidSideNodeIndex element with more than one midsidenodeindex..."
                                    );
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          iVar7 = TPZVec<long>::NElements(local_1b8);
          if (iVar7 == 1) {
            pdVar8 = (double *)TPZVec<long>::operator[](local_1b8,0);
            *local_18 = *pdVar8;
          }
          else {
            iVar7 = TPZVec<long>::NElements(local_1b8);
            if (iVar7 == 0) {
              *local_18 = -NAN;
            }
            else {
              (**(code **)(*(long *)in_RDI + 0x210))();
              local_1e8 = 0;
              TPZVec<double>::TPZVec
                        (in_stack_fffffffffffffcc0,(int64_t)in_stack_fffffffffffffcb8,
                         (double *)in_stack_fffffffffffffcb0);
              (**(code **)(*(long *)in_RDI + 0x210))();
              TPZVec<double>::TPZVec
                        (in_stack_fffffffffffffcc0,(int64_t)in_stack_fffffffffffffcb8,
                         (double *)in_stack_fffffffffffffcb0);
              (**(code **)(*(long *)in_RDI + 0x260))(in_RDI,local_c,local_208);
              (**(code **)(*(long *)in_RDI + 0x228))(in_RDI,local_208,&local_1e0);
              local_218 = 1000000.0;
              local_220 = 0.0;
              pdVar8 = (double *)TPZVec<long>::operator[](local_1b8,0);
              *local_18 = *pdVar8;
              for (local_1c = 0; lVar9 = (long)local_1c, iVar7 = TPZVec<long>::NElements(local_1b8),
                  lVar9 < iVar7; local_1c = local_1c + 1) {
                for (local_20 = 0; iVar2 = local_20,
                    iVar1 = (**(code **)(*(long *)in_RDI + 0x210))(), iVar2 < iVar1;
                    local_20 = local_20 + 1) {
                  pTVar10 = TPZGeoEl::Mesh(in_RDI);
                  TPZGeoMesh::NodeVec(pTVar10);
                  TPZVec<long>::operator[](local_1b8,(long)local_1c);
                  TPZChunkVector<TPZGeoNode,_10>::operator[]
                            (in_stack_fffffffffffffcd0,(int64_t)in_stack_fffffffffffffcc8);
                  RVar11 = TPZGeoNode::Coord(in_stack_fffffffffffffcb8,
                                             (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
                  pdVar8 = TPZVec<double>::operator[](&local_1e0,(long)local_20);
                  dVar4 = *pdVar8;
                  pTVar10 = TPZGeoEl::Mesh(in_RDI);
                  TPZGeoMesh::NodeVec(pTVar10);
                  in_stack_fffffffffffffcd0 =
                       (TPZChunkVector<TPZGeoNode,_10> *)
                       TPZVec<long>::operator[](local_1b8,(long)local_1c);
                  in_stack_fffffffffffffcc8 =
                       TPZChunkVector<TPZGeoNode,_10>::operator[]
                                 (in_stack_fffffffffffffcd0,(int64_t)in_stack_fffffffffffffcc8);
                  RVar12 = TPZGeoNode::Coord(in_stack_fffffffffffffcb8,
                                             (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
                  in_stack_fffffffffffffcb8 =
                       (TPZGeoNode *)TPZVec<double>::operator[](&local_1e0,(long)local_20);
                  local_220 = (RVar11 - dVar4) *
                              (RVar12 - (double)(in_stack_fffffffffffffcb8->super_TPZSavable).
                                                _vptr_TPZSavable) + local_220;
                }
                if (local_220 < local_218) {
                  local_218 = local_220;
                  in_stack_fffffffffffffcb0 =
                       (TPZVec<double> *)TPZVec<long>::operator[](local_1b8,(long)local_1c);
                  *local_18 = (double)in_stack_fffffffffffffcb0->_vptr_TPZVec;
                }
              }
              TPZVec<double>::~TPZVec(in_stack_fffffffffffffcb0);
              TPZVec<double>::~TPZVec(in_stack_fffffffffffffcb0);
            }
          }
          TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x15cbfaf);
          local_148 = 0;
        }
        TPZStack<TPZGeoElSide,_10>::~TPZStack((TPZStack<TPZGeoElSide,_10> *)0x15cbfc7);
      }
    }
  }
  return;
}

Assistant:

TPZStack<T, NumExtAlloc>::TPZStack() : TPZManVector<T, NumExtAlloc>(0) {
	this->Expand(NumExtAlloc);
}